

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O3

Frc_Man_t * Frc_ManStartSimple(Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  Frc_Man_t *pFVar6;
  Vec_Int_t *p;
  int *piVar7;
  Vec_Int_t *p_00;
  uint *puVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  int local_64;
  
  Gia_ManCreateRefs(pGia);
  pFVar6 = (Frc_Man_t *)calloc(1,0x38);
  pFVar6->pGia = pGia;
  pFVar6->nRegs = pGia->nRegs;
  pVVar10 = pGia->vCis;
  iVar2 = pVVar10->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar11 = iVar2;
  if (iVar2 - 1U < 0xf) {
    iVar11 = 0x10;
  }
  p->nSize = 0;
  p->nCap = iVar11;
  if (iVar11 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar11 << 2);
  }
  p->pArray = piVar7;
  pFVar6->vCis = p;
  pVVar5 = pGia->vCos;
  iVar11 = pVVar5->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar11 - 1U) {
    iVar13 = iVar11;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar13;
  if (iVar13 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar13 << 2);
  }
  p_00->pArray = piVar7;
  pFVar6->vCos = p_00;
  uVar14 = pGia->nObjs;
  uVar16 = (ulong)uVar14;
  iVar11 = pVVar5->nSize;
  uVar4 = uVar14 * 10 + iVar11 * 2 + ~(iVar11 + iVar2) * 4;
  pFVar6->nObjData = uVar4;
  puVar8 = (uint *)calloc((long)(int)uVar4,4);
  pFVar6->pObjData = (int *)puVar8;
  pGVar9 = pGia->pObjs;
  pGVar9->Value = 0;
  *puVar8 = *puVar8 & 0xf;
  if ((int)uVar14 < 1) {
LAB_0073e9d3:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar14 = *pGia->pRefs;
  puVar8[1] = uVar14;
  uVar14 = uVar14 + 6;
  pFVar6->nObjs = 1;
  local_64 = 1;
  if (iVar2 < 1) {
    uVar18 = 1;
  }
  else {
    lVar12 = 0;
    do {
      lVar15 = lVar12;
      iVar2 = pVVar10->pArray[lVar15];
      if (((long)iVar2 < 0) || ((int)uVar16 <= iVar2)) goto LAB_0073e9b4;
      if (pGVar9 == (Gia_Obj_t *)0x0) {
        uVar18 = (ulong)((int)lVar15 + 1);
        goto LAB_0073e6f6;
      }
      pGVar1 = pGVar9 + iVar2;
      pGVar1->Value = uVar14;
      Vec_IntPush(p,uVar14);
      puVar8[(long)(int)uVar14 + 3] = uVar14;
      uVar17 = puVar8[(int)uVar14];
      puVar8[(int)uVar14] = uVar17 & 0xf;
      pGVar9 = pGia->pObjs;
      if (pGVar1 < pGVar9) goto LAB_0073e9d3;
      iVar2 = pGia->nObjs;
      uVar16 = (ulong)iVar2;
      if (pGVar9 + uVar16 <= pGVar1) goto LAB_0073e9d3;
      uVar3 = pGia->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar9) >> 2) * -0x55555555];
      puVar8[(long)(int)uVar14 + 1] = uVar3;
      puVar8[(int)uVar14] = uVar17 & 0xe;
      uVar14 = uVar14 + uVar3 + 6;
      pFVar6->nObjs = (int)lVar15 + 2;
      pVVar10 = pGia->vCis;
      lVar12 = lVar15 + 1;
    } while (lVar15 + 1 < (long)pVVar10->nSize);
    uVar18 = lVar15 + 2;
    if (iVar2 < 1) {
      local_64 = 1;
      goto LAB_0073e815;
    }
  }
LAB_0073e6f6:
  lVar15 = 8;
  lVar12 = 0;
  do {
    pGVar9 = pGia->pObjs;
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    uVar17 = *(uint *)((long)pGVar9 + lVar15 + -8);
    if ((~uVar17 & 0x1fffffff) != 0 && -1 < (int)uVar17) {
      piVar7 = pGia->pRefs;
      if (piVar7[lVar12] < 1) {
        __assert_fail("Gia_ObjRefNum( pGia, pObj ) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                      ,0xc2,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
      }
      *(uint *)(&pGVar9->field_0x0 + lVar15) = uVar14;
      puVar8[(long)(int)uVar14 + 3] = uVar14;
      puVar8[(int)uVar14] = puVar8[(int)uVar14] & 0xf | 0x20;
      puVar8[(long)(int)uVar14 + 1] = piVar7[lVar12];
      Frc_ObjAddFanin((Frc_Obj_t *)(puVar8 + (int)uVar14),
                      (Frc_Obj_t *)
                      (puVar8 + *(int *)((long)pGVar9 +
                                        (ulong)((*(uint *)((long)pGVar9 + lVar15 + -8) & 0x1fffffff)
                                               << 2) * -3 + lVar15)));
      Frc_ObjAddFanin((Frc_Obj_t *)(puVar8 + (int)uVar14),
                      (Frc_Obj_t *)
                      (puVar8 + *(int *)((long)pGVar9 +
                                        (ulong)((*(uint *)((long)pGVar9 + lVar15 + -4) & 0x1fffffff)
                                               << 2) * -3 + lVar15)));
      uVar14 = puVar8[(long)(int)uVar14 + 1] + (puVar8[(int)uVar14] >> 4) + uVar14 + 6;
      local_64 = local_64 + 1;
      uVar17 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar17;
      pFVar6->nObjs = uVar17;
      uVar16 = (ulong)(uint)pGia->nObjs;
    }
    lVar12 = lVar12 + 1;
    lVar15 = lVar15 + 0xc;
  } while (lVar12 < (int)uVar16);
LAB_0073e815:
  uVar17 = (uint)uVar18;
  pVVar10 = pGia->vCos;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      uVar17 = (uint)uVar18;
      iVar2 = pVVar10->pArray[lVar12];
      if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) {
LAB_0073e9b4:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar9 = pGia->pObjs + iVar2;
      pGVar9->Value = uVar14;
      Vec_IntPush(p_00,uVar14);
      puVar8[(long)(int)uVar14 + 3] = uVar14;
      uVar3 = puVar8[(int)uVar14];
      puVar8[(long)(int)uVar14 + 1] = 0;
      puVar8[(int)uVar14] = uVar3 & 0xd | 0x12;
      Frc_ObjAddFanin((Frc_Obj_t *)(puVar8 + (int)uVar14),
                      (Frc_Obj_t *)
                      (puVar8 + (int)pGVar9[-(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff)].
                                     Value));
      uVar14 = puVar8[(long)(int)uVar14 + 1] + (puVar8[(int)uVar14] >> 4) + uVar14 + 6;
      uVar17 = uVar17 + 1;
      uVar18 = (ulong)uVar17;
      pFVar6->nObjs = uVar17;
      lVar12 = lVar12 + 1;
      pVVar10 = pGia->vCos;
    } while (lVar12 < pVVar10->nSize);
  }
  if (local_64 != uVar17 - (p->nSize + p_00->nSize)) {
    __assert_fail("nNodes == Frc_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0xe8,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
  }
  if (uVar14 != uVar4) {
    __assert_fail("hHandle == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0xe9,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
  }
  uVar4 = pGia->nObjs;
  if ((0 < (int)uVar4) && (pGVar9 = pGia->pObjs, pGVar9 != (Gia_Obj_t *)0x0)) {
    lVar12 = 0;
    do {
      lVar15 = (long)*(int *)((long)&pGVar9->Value + lVar12);
      if (lVar15 != -1) {
        if (puVar8[lVar15] >> 4 != puVar8[lVar15 + 5]) {
          __assert_fail("pObjLog->nFanins == pObjLog->iFanin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0xf2,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
        }
        if (puVar8[lVar15 + 1] != puVar8[lVar15 + 2]) {
          __assert_fail("pObjLog->nFanouts == pObjLog->iFanout",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0xf3,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
        }
        puVar8[lVar15 + 2] = 0;
        puVar8[lVar15 + 5] = 0;
      }
      lVar12 = lVar12 + 0xc;
    } while ((ulong)uVar4 * 0xc != lVar12);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  return pFVar6;
}

Assistant:

Frc_Man_t * Frc_ManStartSimple( Gia_Man_t * pGia )
{
    Frc_Man_t * p;
    Frc_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj;//, * pObjRi, * pObjRo;
    int i, nNodes, hHandle = 0;
    // prepare the AIG
    Gia_ManCreateRefs( pGia );
    // create logic network
    p = ABC_CALLOC( Frc_Man_t, 1 );
    p->pGia  = pGia;
    p->nRegs = Gia_ManRegNum(pGia);
    p->vCis  = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos  = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Frc_Obj_t) / 4) * Gia_ManObjNum(pGia) + 2 * (2 * Gia_ManAndNum(pGia) + Gia_ManCoNum(pGia));
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    // create constant node
    Gia_ManConst0(pGia)->Value = hHandle;
    pObjLog = Frc_ManObj( p, hHandle );
    pObjLog->hHandle  = hHandle;
    pObjLog->nFanins  = 0;
    pObjLog->nFanouts = Gia_ObjRefNum( pGia, Gia_ManConst0(pGia) );
    // count objects
    hHandle += Frc_ObjSize( pObjLog );
    nNodes = 1;
    p->nObjs++;
    // create the PIs
    Gia_ManForEachCi( pGia, pObj, i )
    {
        // create PI object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCis, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 0;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->fCi = 0;
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // create internal nodes
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        assert( Gia_ObjRefNum( pGia, pObj ) > 0 );
        // create node object
        pObj->Value = hHandle;
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 2;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        // add fanins
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) ); 
        Frc_ObjAddFanin( pObjLog, pFanLog );
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin1(pObj)) ); 
        Frc_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        nNodes++;
        p->nObjs++;
    }
    // create the POs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        // create PO object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCos, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 1;
        pObjLog->nFanouts = 0;
        pObjLog->fCo = 1;
        // add fanins
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Frc_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // connect registers
//    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, i )
//        Frc_ObjAddFanin( Frc_ManObj(p,Gia_ObjValue(pObjRo)), Frc_ManObj(p,Gia_ObjValue(pObjRi)) );
    assert( nNodes  == Frc_ManNodeNum(p) );
    assert( hHandle == p->nObjData );
    if ( hHandle != p->nObjData )
        printf( "Frc_ManStartSimple(): Fatal error in internal representation.\n" );
    // make sure the fanin/fanout counters are correct
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !~Gia_ObjValue(pObj) )
            continue;
        pObjLog = Frc_ManObj( p, Gia_ObjValue(pObj) );
        assert( pObjLog->nFanins  == pObjLog->iFanin );
        assert( pObjLog->nFanouts == pObjLog->iFanout );
        pObjLog->iFanin = pObjLog->iFanout = 0;
    }
    ABC_FREE( pGia->pRefs );
    return p;
}